

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O0

void __thiscall cppjieba::Jieba::ResetSeparators(Jieba *this,string *s)

{
  string *in_stack_00000530;
  SegmentBase *in_stack_00000538;
  
  SegmentBase::ResetSeparators(in_stack_00000538,in_stack_00000530);
  SegmentBase::ResetSeparators(in_stack_00000538,in_stack_00000530);
  SegmentBase::ResetSeparators(in_stack_00000538,in_stack_00000530);
  SegmentBase::ResetSeparators(in_stack_00000538,in_stack_00000530);
  SegmentBase::ResetSeparators(in_stack_00000538,in_stack_00000530);
  return;
}

Assistant:

void ResetSeparators(const string& s) {
    //TODO
    mp_seg_.ResetSeparators(s);
    hmm_seg_.ResetSeparators(s);
    mix_seg_.ResetSeparators(s);
    full_seg_.ResetSeparators(s);
    query_seg_.ResetSeparators(s);
  }